

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ec30ed::AV1FwdTxfm2d_RunFwdAccuracyCheck_Test::TestBody
          (AV1FwdTxfm2d_RunFwdAccuracyCheck_Test *this)

{
  AV1FwdTxfm2d *in_stack_000000e0;
  
  AV1FwdTxfm2d::RunFwdAccuracyCheck(in_stack_000000e0);
  return;
}

Assistant:

TEST_P(AV1FwdTxfm2d, RunFwdAccuracyCheck) { RunFwdAccuracyCheck(); }